

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

uint __thiscall
Validate::CheckIDDoesNotExceedMaxLimit(Validate *this,char *idName,unsigned_long_long initialID)

{
  OASIS_FLOAT *pOVar1;
  OASIS_FLOAT *pOVar2;
  OASIS_FLOAT *pOVar3;
  int iVar4;
  uint extraout_EAX;
  uint extraout_EAX_00;
  char *pcVar5;
  int *piVar6;
  
  if (0xffffffff00000000 < initialID - 0x100000000) {
    return (uint)initialID;
  }
  CheckIDDoesNotExceedMaxLimit();
  pcVar5 = fgets(this->line_,0x1000,_stdin);
  if (pcVar5 != (char *)0x0) {
    pOVar1 = &(((ValidateDamageBin *)this)->dbd_).bin_from;
    pOVar2 = &(((ValidateDamageBin *)this)->dbd_).bin_to;
    pOVar3 = &(((ValidateDamageBin *)this)->dbd_).interpolation;
    piVar6 = &(((ValidateDamageBin *)this)->dbd_).interval_type;
    iVar4 = __isoc99_sscanf(this,"%d,%f,%f,%f,%d",&((ValidateDamageBin *)this)->dbd_,pOVar1,pOVar2,
                            pOVar3,piVar6);
    if (iVar4 == 5) {
      ValidateDamageBin::CheckFormat((ValidateDamageBin *)this);
      return extraout_EAX;
    }
    iVar4 = __isoc99_sscanf(this,"%d,%f,%f,%f",&((ValidateDamageBin *)this)->dbd_,pOVar1,pOVar2,
                            pOVar3,piVar6);
    if (iVar4 == 4) {
      (((ValidateDamageBin *)this)->dbd_).interval_type = 0;
      ((ValidateDamageBin *)this)->newFormat_ = true;
      return 4;
    }
    ValidateDamageBin::CheckFormat((ValidateDamageBin *)this);
  }
  ValidateDamageBin::CheckFormat((ValidateDamageBin *)this);
  return extraout_EAX_00;
}

Assistant:

unsigned int Validate::CheckIDDoesNotExceedMaxLimit(char *idName,
	unsigned long long initialID) {
/* Check ID does not exceed maximum value for unsigned integers. */

  // No need to check for negative numbers as ID is of unsigned long long data
  // type and therefore negative numbers should exceed the maximum value for an
  // unsigned integer (i.e. UINT_MAX).
  if (initialID == 0 || initialID > UINT_MAX) {

    fprintf(stderr, "ERROR: %s ID %lld on line %d does not lie within"
		    " permitted range [%d, %u]. Please reassign %s IDs to lie"
		    " within this range.\n",
		    idName, (long long)initialID, lineno_, MIN_ID_, UINT_MAX,
		    idName);
    PrintErrorMessage();

  }

  return (unsigned int)initialID;

}